

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::Desugarer::makeArrayComprehension(Desugarer *this,ArrayComprehension *ast)

{
  pointer pcVar1;
  int iVar2;
  pointer pCVar3;
  AST *pAVar4;
  Kind *pKVar5;
  size_type sVar6;
  LocationRange *args;
  Identifier *pIVar7;
  pointer pCVar8;
  Binary *pBVar9;
  Apply *pAVar10;
  int *piVar11;
  Var *pVVar12;
  Index *body;
  Function *pFVar13;
  LiteralString *b;
  Array *expr;
  long lVar14;
  Fodder *pFVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  Desugarer *pDVar22;
  long lVar23;
  long lVar24;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *pvVar25;
  ulong uVar26;
  long lVar27;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  initializer_list<jsonnet::internal::ArgParam> __l_01;
  initializer_list<jsonnet::internal::Local::Bind> __l_02;
  initializer_list<jsonnet::internal::ArgParam> __l_03;
  bool local_4ed;
  bool local_4ec;
  bool local_4eb;
  bool local_4ea;
  bool local_4e9;
  size_type local_4e8;
  Desugarer *local_4e0;
  sockaddr *local_4d8;
  allocator_type local_4cb;
  allocator_type local_4ca;
  allocator_type local_4c9;
  ArrayComprehension *local_4c8;
  Array *local_4c0;
  AST *in;
  pointer local_4b0;
  AST *out;
  long local_4a0;
  BinaryOp local_494;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _i;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _aux;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  LocationRange *local_420;
  AST *one;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_410;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  local_3f8;
  Binds local_3d8;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_3c0;
  Fodder *local_3a8;
  Fodder *local_3a0;
  LiteralNumber *local_398;
  Fodder *local_390;
  ulong local_388;
  long local_380;
  Error *local_378;
  Var *local_370;
  Apply *local_368;
  Apply *local_360;
  Conditional *local_358;
  void *local_350;
  void *local_348;
  Var *local_340;
  Var *local_338;
  Local *local_330;
  Apply *local_328;
  Var *local_320;
  Binary *local_318;
  Conditional *local_310;
  UStringStream ss;
  ArgParam local_2b0;
  Desugarer local_258 [11];
  undefined1 local_1a8 [88];
  ArgParam local_150;
  ArgParam local_f8;
  ArgParam local_a0;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_48;
  
  pCVar8 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar3 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_398 = Allocator::
              make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                        (this->alloc,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,(char (*) [4])"0.0");
  one = &Allocator::
         make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                   (this->alloc,(LocationRange *)E,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(char (*) [4])0x244a0f)->super_AST;
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&ss,L"$r",L"");
  local_4c0 = (Array *)Allocator::makeIdentifier(this->alloc,&ss.buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
    operator_delete(ss.buf._M_dataplus._M_p,
                    CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4 + 4)
    ;
  }
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&ss,L"$l",L"");
  local_4b0 = (pointer)Allocator::makeIdentifier(this->alloc,&ss.buf);
  pvVar25 = (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)(((long)pCVar8 - (long)pCVar3 >> 5) * -0x5555555555555555);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
    operator_delete(ss.buf._M_dataplus._M_p,
                    CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4 + 4)
    ;
  }
  uVar16 = (uint)pvVar25;
  local_4e8 = (size_type)(int)uVar16;
  local_4e0 = this;
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_i,local_4e8,(allocator_type *)&ss);
  pcVar1 = (pointer)(local_1a8 + 0x10);
  local_4d8 = (sockaddr *)pvVar25;
  local_4c8 = ast;
  if (0 < (int)uVar16) {
    uVar26 = 0;
    do {
      ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
      ss.buf._M_string_length = 0;
      ss.buf.field_2._M_local_buf[0] = L'\0';
      ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
      ::append(&ss.buf,L"$i_");
      UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar26);
      local_1a8._0_8_ = pcVar1;
      ::std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_1a8,ss.buf._M_dataplus._M_p,
                 ss.buf._M_dataplus._M_p + ss.buf._M_string_length);
      pIVar7 = Allocator::makeIdentifier(local_4e0->alloc,(UString *)local_1a8);
      _i.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar26] = pIVar7;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
        operator_delete(ss.buf._M_dataplus._M_p,
                        CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4
                        + 4);
      }
      uVar26 = uVar26 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar26);
  }
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&_aux,local_4e8,(allocator_type *)&ss);
  if (0 < (int)(uint)local_4d8) {
    uVar16 = (uint)local_4d8 & 0x7fffffff;
    uVar26 = 0;
    do {
      ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
      ss.buf._M_string_length = 0;
      ss.buf.field_2._M_local_buf[0] = L'\0';
      ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
      ::append(&ss.buf,L"$aux_");
      UStringStream::operator<<((UStringStream *)&ss.buf,(int)uVar26);
      local_1a8._0_8_ = pcVar1;
      ::std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_1a8,ss.buf._M_dataplus._M_p,
                 ss.buf._M_dataplus._M_p + ss.buf._M_string_length);
      pIVar7 = Allocator::makeIdentifier(local_4e0->alloc,(UString *)local_1a8);
      _aux.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar26] = pIVar7;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)ss.buf._M_dataplus._M_p != &ss.buf.field_2) {
        operator_delete(ss.buf._M_dataplus._M_p,
                        CONCAT44(ss.buf.field_2._M_local_buf[1],ss.buf.field_2._M_local_buf[0]) * 4
                        + 4);
      }
      uVar26 = uVar26 + 1;
    } while (uVar16 != uVar26);
  }
  pDVar22 = local_4e0;
  pCVar8 = (local_4c8->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar8->kind != FOR) {
    __assert_fail("ast->specs[0].kind == ComprehensionSpec::FOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                  ,0x1b4,
                  "AST *jsonnet::internal::Desugarer::makeArrayComprehension(ArrayComprehension *)")
    ;
  }
  uVar16 = (uint)local_4d8;
  uVar20 = uVar16 - 1;
  lVar23 = (long)(int)uVar20 * 8 + 8;
  pCVar8 = pCVar8 + (int)uVar20;
  do {
    lVar23 = lVar23 + -8;
    pKVar5 = &pCVar8->kind;
    pCVar8 = pCVar8 + -1;
  } while (*pKVar5 != FOR);
  pAVar4 = local_4c8->body;
  ss.buf._M_dataplus._M_p =
       *(pointer *)
        ((long)_aux.
               super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar23);
  local_440._0_8_ =
       Allocator::
       make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                 (local_4e0->alloc,(LocationRange *)E,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(Identifier **)&ss);
  local_f8.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        ((long)_i.
               super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar23);
  local_460._0_8_ =
       Allocator::
       make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                 (pDVar22->alloc,(LocationRange *)E,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(Identifier **)&local_f8);
  local_3c0.
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  pBVar9 = Allocator::
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                     (pDVar22->alloc,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)local_460,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_3c0,&one);
  ArgParam::ArgParam((ArgParam *)&ss,&pBVar9->super_AST,(Fodder *)EF);
  pDVar22 = local_4e0;
  local_f8.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4c0;
  local_410.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)Allocator::
                make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                          (local_4e0->alloc,(LocationRange *)E,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(Identifier **)&local_f8);
  local_3d8.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  local_f8.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)singleton(pDVar22,local_4c8->body);
  pBVar9 = Allocator::
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Array*>
                     (local_4e0->alloc,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(Var **)&local_410,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(BinaryOp *)&local_3d8,(Array **)&local_f8);
  ArgParam::ArgParam(&local_2b0,&pBVar9->super_AST,(Fodder *)EF);
  __l._M_len = 2;
  __l._M_array = (iterator)&ss;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_1a8,__l,(allocator_type *)&local_48);
  local_3f8.
  super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_3f8.
                        super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  out = (AST *)CONCAT71(out._1_7_,1);
  pAVar10 = Allocator::
            make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                      (local_4e0->alloc,&pAVar4->location,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(Var **)local_440,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                              *)local_1a8,(bool *)&local_3f8,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(bool *)&out);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             local_1a8);
  lVar23 = -0xb0;
  pFVar15 = &local_2b0.commaFodder;
  do {
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(pFVar15);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(pFVar15 + -2) + 0x10));
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(pFVar15 + -3) + 8));
    pFVar15 = (Fodder *)((long)(pFVar15 + -4) + 8);
    lVar23 = lVar23 + 0x58;
  } while (lVar23 != 0);
  in = &pAVar10->super_AST;
  if (0 < (int)uVar16) {
    local_420 = &(local_4c8->super_AST).location;
    uVar26 = (ulong)uVar20;
    lVar23 = (ulong)(uVar16 & 0x7fffffff) * 8;
    lVar14 = (ulong)(uVar16 & 0x7fffffff) * 0x60 + -0xc0;
    local_390 = &local_2b0.commaFodder;
    local_3a8 = &local_a0.commaFodder;
    local_3a0 = &local_150.commaFodder;
    pDVar22 = local_4e0;
    do {
      lVar23 = lVar23 + -8;
      pCVar8 = (local_4c8->specs).
               super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = uVar26 - 1;
      local_380 = lVar14;
      if (uVar26 == 0) {
        ss.buf._M_dataplus._M_p = (pointer)local_4c0;
        out = &Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                         (pDVar22->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Identifier **)&ss)->super_AST;
        uVar19 = uVar26;
      }
      else {
        piVar11 = (int *)((long)&pCVar8->kind + lVar14);
        lVar14 = lVar23;
        do {
          lVar14 = lVar14 + -8;
          iVar2 = *piVar11;
          piVar11 = piVar11 + -0x18;
        } while (iVar2 != 0);
        ss.buf._M_dataplus._M_p =
             *(pointer *)
              ((long)_aux.
                     super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar14);
        local_4e8 = uVar26;
        local_4a0 = lVar23;
        local_440._0_8_ =
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (pDVar22->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&ss);
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)_i.
                     super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar14);
        local_460._0_8_ =
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (pDVar22->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&local_f8);
        local_410.
        super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_410.
                               super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
        pBVar9 = Allocator::
                 make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                           (pDVar22->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(Var **)local_460,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(BinaryOp *)&local_410,&one);
        ArgParam::ArgParam((ArgParam *)&ss,&pBVar9->super_AST,(Fodder *)EF);
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4c0;
        pVVar12 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar22->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_f8);
        ArgParam::ArgParam(&local_2b0,&pVVar12->super_AST,(Fodder *)EF);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&ss;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               local_1a8,__l_00,(allocator_type *)&local_f8);
        local_3c0.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             (uint)local_3c0.
                   super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0xffffff00;
        local_3d8.
        super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             CONCAT31(local_3d8.
                      super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_3_,1);
        out = &Allocator::
               make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                         (pDVar22->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Var **)local_440,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                 *)local_1a8,(bool *)&local_3c0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(bool *)&local_3d8)->super_AST;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )local_1a8);
        lVar14 = -0xb0;
        pFVar15 = local_390;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar15);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar15 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar15 + -3) + 8));
          pFVar15 = (Fodder *)((long)(pFVar15 + -4) + 8);
          lVar14 = lVar14 + 0x58;
          uVar19 = local_4e8;
          lVar23 = local_4a0;
        } while (lVar14 != 0);
      }
      pCVar8 = pCVar8 + uVar19;
      if (pCVar8->kind == FOR) {
        local_4a0 = lVar23;
        local_388 = uVar17;
        bind((Desugarer *)&ss,(int)pDVar22,(sockaddr *)local_4b0,(socklen_t)pCVar8->expr);
        local_4d8 = (sockaddr *)
                    _aux.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19];
        ArgParam::ArgParam((ArgParam *)local_1a8,(Fodder *)EF,
                           _i.
                           super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19],(Fodder *)EF);
        ArgParam::ArgParam(&local_150,(Fodder *)EF,(Identifier *)local_4c0,(Fodder *)EF);
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)local_1a8;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector(&local_3c0,__l_01,&local_4c9);
        local_4e9 = false;
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_i.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19];
        local_320 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_f8);
        local_494 = BOP_GREATER_EQ;
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4b0;
        pVVar12 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar22->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_f8);
        local_328 = length(pDVar22,&pVVar12->super_AST);
        local_318 = Allocator::
                    make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Apply*>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_320,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_494,&local_328);
        pIVar7 = pCVar8->var;
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4b0;
        local_338 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_f8);
        local_4ea = false;
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_i.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19];
        local_340 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_f8);
        local_348 = (void *)0x0;
        local_350 = (void *)0x0;
        body = Allocator::
               make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (pDVar22->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_338,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_4ea,&local_340,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_348,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_350,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF);
        singleBind(&local_3d8,pDVar22,pIVar7,&body->super_AST);
        args = local_420;
        local_330 = Allocator::
                    make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                              (pDVar22->alloc,local_420,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_3d8,&in);
        local_310 = Allocator::
                    make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Local*>
                              (pDVar22->alloc,args,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_318,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&out,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_330);
        pFVar13 = Allocator::
                  make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Conditional*>
                            (pDVar22->alloc,args,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_3c0,&local_4e9,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&local_310);
        bind(local_258,(int)pDVar22,local_4d8,(socklen_t)pFVar13);
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&ss;
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        vector(&local_410,__l_02,&local_4ca);
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = local_4b0;
        pVVar12 = Allocator::
                  make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                            (pDVar22->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(Identifier **)&local_f8);
        pAVar10 = type(pDVar22,&pVVar12->super_AST);
        local_440._0_8_ = local_440 + 0x10;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)local_440,L"array",L"");
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_f8.idFodder.
                               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
        local_4e8 = uVar19;
        b = Allocator::
            make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                      (pDVar22->alloc,(LocationRange *)E,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                              *)local_440,(TokenKind *)&local_f8,(char (*) [1])0x25f777,
                       (char (*) [1])0x25f777);
        local_360 = equals(pDVar22,args,&pAVar10->super_AST,&b->super_AST);
        local_f8.idFodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)_aux.
                      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_4e8];
        local_370 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)&local_f8);
        ArgParam::ArgParam(&local_f8,&local_398->super_AST,(Fodder *)EF);
        if (local_4e8 == 0) {
          local_3f8.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3f8.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3f8.
          super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_4eb = false;
          expr = Allocator::
                 make<jsonnet::internal::Array,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           (pDVar22->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_3f8,&local_4eb,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF);
        }
        else {
          local_460._0_8_ = local_4c0;
          expr = (Array *)Allocator::
                          make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                                    (pDVar22->alloc,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(Identifier **)local_460);
        }
        sVar6 = local_4e8;
        ArgParam::ArgParam(&local_a0,&expr->super_AST,(Fodder *)EF);
        __l_03._M_len = 2;
        __l_03._M_array = &local_f8;
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        vector(&local_48,__l_03,&local_4cb);
        local_4ec = false;
        local_4ed = true;
        local_368 = Allocator::
                    make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                              (pDVar22->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_370,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_48,&local_4ec,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_4ed);
        local_460._0_8_ = local_460 + 0x10;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)local_460,L"In comprehension, can only iterate over array.",L"");
        local_378 = error(pDVar22,args,(UString *)local_460);
        local_358 = Allocator::
                    make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                              (pDVar22->alloc,args,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_360,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_368,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_378);
        in = &Allocator::
              make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                        (pDVar22->alloc,args,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_410,&local_358)->super_AST;
        if ((Array *)local_460._0_8_ != (Array *)(local_460 + 0x10)) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ * 4 + 4);
        }
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_48);
        lVar23 = -0xb0;
        pFVar15 = local_3a8;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar15);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar15 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&pFVar15[-3].
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          pFVar15 = (Fodder *)
                    &pFVar15[-4].
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar23 = lVar23 + 0x58;
        } while (lVar23 != 0);
        if (sVar6 == 0) {
          ::std::
          vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ::~vector(&local_3f8);
        }
        if ((Var *)local_440._0_8_ != (Var *)(local_440 + 0x10)) {
          operator_delete((void *)local_440._0_8_,local_440._16_8_ * 4 + 4);
        }
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        ~vector(&local_410);
        lVar24 = 0xd0;
        lVar27 = 0xf8;
        lVar18 = 0x110;
        lVar14 = 0x130;
        lVar21 = 0x148;
        lVar23 = 0xb0;
        do {
          local_4d8 = (sockaddr *)((long)&ss.buf._M_dataplus._M_p + lVar23);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar21));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar14));
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)((long)&ss.buf._M_dataplus._M_p + lVar18));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar27));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)&ss.buf._M_dataplus._M_p + lVar24));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)local_4d8);
          lVar24 = lVar24 + -0xb0;
          lVar27 = lVar27 + -0xb0;
          lVar18 = lVar18 + -0xb0;
          lVar14 = lVar14 + -0xb0;
          lVar21 = lVar21 + -0xb0;
          lVar23 = lVar23 + -0xb0;
        } while (lVar23 != -0xb0);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        ~vector(&local_3d8);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_3c0);
        lVar14 = -0xb0;
        pFVar15 = local_3a0;
        do {
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(pFVar15);
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)((long)(pFVar15 + -2) + 0x10));
          ::std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&pFVar15[-3].
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          pFVar15 = (Fodder *)
                    &pFVar15[-4].
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar14 = lVar14 + 0x58;
          uVar26 = local_388;
          uVar19 = local_4e8;
          pDVar22 = local_4e0;
          lVar23 = local_4a0;
        } while (lVar14 != 0);
      }
      else {
        uVar26 = uVar17;
        if (pCVar8->kind == IF) {
          in = &Allocator::
                make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                          (pDVar22->alloc,local_420,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&pCVar8->expr,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&in,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&out)->super_AST;
        }
      }
      lVar14 = local_380 + -0x60;
    } while (0 < (long)uVar19);
  }
  pAVar4 = in;
  if (_aux.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(_aux.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)_aux.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)_aux.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (_i.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(_i.
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)_i.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)_i.
                          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pAVar4;
}

Assistant:

AST* makeArrayComprehension(ArrayComprehension *ast) {
        int n = ast->specs.size();
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        AST *one = make<LiteralNumber>(E, EF, "1.0");
        auto *_r = id(U"$r");
        auto *_l = id(U"$l");
        std::vector<const Identifier *> _i(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$i_" << i;
            _i[i] = id(ss.str());
        }
        std::vector<const Identifier *> _aux(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$aux_" << i;
            _aux[i] = id(ss.str());
        }

        // Build it from the inside out.  We keep wrapping 'in' with more ASTs.
        assert(ast->specs[0].kind == ComprehensionSpec::FOR);

        int last_for = n - 1;
        while (ast->specs[last_for].kind != ComprehensionSpec::FOR)
            last_for--;
        // $aux_{last_for}($i_{last_for} + 1, $r + [body])
        AST *in = make<Apply>(
            ast->body->location,
            EF,
            var(_aux[last_for]),
            EF,
            ArgParams{{make<Binary>(E, EF, var(_i[last_for]), EF, BOP_PLUS, one), EF},
                {make<Binary>(E, EF, var(_r), EF, BOP_PLUS, singleton(ast->body)), EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
        for (int i = n - 1; i >= 0; --i) {
            const ComprehensionSpec &spec = ast->specs[i];
            AST *out;
            if (i > 0) {
                int prev_for = i - 1;
                while (ast->specs[prev_for].kind != ComprehensionSpec::FOR)
                    prev_for--;

                // aux_{prev_for}($i_{prev_for} + 1, $r)
                out = make<Apply>(  // False branch.
                    E,
                    EF,
                    var(_aux[prev_for]),
                    EF,
                    ArgParams{{
                        make<Binary>(E, EF, var(_i[prev_for]), EF, BOP_PLUS, one),
                            EF,
                            },
                      {
                        var(_r),
                            EF,
                            }},
                    false,  // trailingComma
                    EF,
                    EF,
                    true  // tailstrict
                );
            } else {
                out = var(_r);
            }
            switch (spec.kind) {
                case ComprehensionSpec::IF: {
                  /*
                    if [[[...cond...]]] then
                    [[[...in...]]]
                    else
                    [[[...out...]]]
                  */
                    in = make<Conditional>(ast->location,
                                           EF,
                                           spec.expr,
                                           EF,
                                           in,  // True branch.
                                           EF,
                                           out);  // False branch.
                } break;
                case ComprehensionSpec::FOR: {
                    /*
                      local $l = [[[...array...]]]
                      aux_{i}(i_{i}, r) =
                      if i_{i} >= std.length($l) then
                      [[[...out...]]]
                      else
                      local [[[...var...]]] = $l[i_{i}];
                      [[[...in...]]];
                      if std.type($l) == "array" then
                      aux_{i}(0, $r) tailstrict
                      else
                      error "In comprehension, can only iterate over array..";
                    */
                    in = make<Local>(
                        ast->location,
                        EF,
                        Local::Binds{
                          bind(_l, spec.expr),  // Need to check expr is an array
                              bind(_aux[i],
                                   make<Function>(
                                       ast->location,
                                       EF,
                                       EF,
                                       ArgParams{{EF, _i[i], EF}, {EF, _r, EF}},
                                       false,  // trailingComma
                                       EF,
                                       make<Conditional>(ast->location,
                                                         EF,
                                                         make<Binary>(E,
                                                                      EF,
                                                                      var(_i[i]),
                                                                      EF,
                                                                      BOP_GREATER_EQ,
                                                                      length(var(_l))),
                                                         EF,
                                                         out,
                                                         EF,
                                                         make<Local>(
                                                             ast->location,
                                                             EF,
                                                             singleBind(spec.var,
                                                                        make<Index>(E,
                                                                                    EF,
                                                                                    var(_l),
                                                                                    EF,
                                                                                    false,
                                                                                    var(_i[i]),
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF)),
                                                             in))))},
                        make<Conditional>(
                            ast->location,
                            EF,
                            equals(ast->location, type(var(_l)), str(U"array")),
                            EF,
                            make<Apply>(
                                E,
                                EF,
                                var(_aux[i]),
                                EF,
                                ArgParams{{zero, EF},
                                  {
                                    i == 0 ? make<Array>(
                                        E, EF, Array::Elements{}, false, EF)
                                        : static_cast<AST *>(var(_r)),
                                        EF,
                                        }},
                                false,  // trailingComma
                                EF,
                                EF,
                                true),  // tailstrict
                            EF,
                            error(ast->location,
                                  U"In comprehension, can only iterate over array.")));
                } break;
            }
        }

        return in;
    }